

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr c4::yml::normalize_tag(csubstr tag)

{
  long lVar1;
  YamlTag_e tag_00;
  size_t in_RDX;
  long lVar2;
  yml *this;
  csubstr tag_01;
  csubstr local_20;
  
  tag_01.str = (char *)tag.len;
  this = (yml *)tag.str;
  tag_01.len = in_RDX;
  tag_00 = to_tag(this,tag_01);
  if (tag_00 == TAG_NONE) {
    if (((char *)0x1 < tag_01.str) && (*this == (yml)0x21)) {
      lVar1 = 0;
      do {
        lVar2 = lVar1;
        if (lVar2 == 1) break;
        lVar1 = lVar2 + 1;
      } while (this[lVar2 + 1] == *(yml *)("!<" + lVar2 + 1));
      if (lVar2 != 0) {
        basic_substring<const_char>::basic_substring
                  (&local_20,(char *)(this + 1),(size_t)(tag_01.str + -1));
        tag = local_20;
      }
    }
  }
  else {
    tag = from_tag(tag_00);
  }
  return tag;
}

Assistant:

csubstr normalize_tag(csubstr tag)
{
    YamlTag_e t = to_tag(tag);
    if(t != TAG_NONE)
        return from_tag(t);
    if(tag.begins_with("!<"))
        tag = tag.sub(1);
    if(tag.begins_with("<!"))
        return tag;
    return tag;
}